

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManRollBack(Gla_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int i;
  int iVar2;
  Gla_Obj_t *pGVar3;
  int iVar4;
  
  iVar4 = 1;
  while( true ) {
    if (p->vAddedNew->nSize <= iVar4) {
      iVar4 = p->nAbsOld;
      while( true ) {
        p_00 = p->vAbs;
        if (p_00->nSize <= iVar4) {
          Vec_IntShrink(p_00,p->nAbsOld);
          return;
        }
        iVar1 = Vec_IntEntry(p_00,iVar4);
        pGVar3 = Gla_ManObj(p,iVar1);
        if ((pGVar3->field_0x4 & 1) == 0) break;
        pGVar3 = Gla_ManObj(p,iVar1);
        pGVar3->field_0x4 = pGVar3->field_0x4 & 0xfe;
        iVar4 = iVar4 + 1;
      }
      __assert_fail("Gla_ManObj( p, iObj )->fAbs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                    ,0x587,"void Gla_ManRollBack(Gla_Man_t *)");
    }
    iVar1 = Vec_IntEntry(p->vAddedNew,iVar4 + -1);
    i = Vec_IntEntry(p->vAddedNew,iVar4);
    pGVar3 = Gla_ManObj(p,iVar1);
    iVar2 = Vec_IntEntry(&pGVar3->vFrames,i);
    if (iVar2 < 1) break;
    pGVar3 = Gla_ManObj(p,iVar1);
    Vec_IntWriteEntry(&pGVar3->vFrames,i,0);
    iVar4 = iVar4 + 2;
  }
  __assert_fail("Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x582,"void Gla_ManRollBack(Gla_Man_t *)");
}

Assistant:

void Gla_ManRollBack( Gla_Man_t * p )
{
    int i, iObj, iFrame;
    Vec_IntForEachEntryDouble( p->vAddedNew, iObj, iFrame, i )
    {
        assert( Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0 );
        Vec_IntWriteEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame, 0 );
    }
    Vec_IntForEachEntryStart( p->vAbs, iObj, i, p->nAbsOld )
    {
        assert( Gla_ManObj( p, iObj )->fAbs == 1 );
        Gla_ManObj( p, iObj )->fAbs = 0;
    }
    Vec_IntShrink( p->vAbs, p->nAbsOld );
}